

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

Element __thiscall wasm::RandomFullLattice::makeElement(RandomFullLattice *this)

{
  Random *this_00;
  undefined8 uVar1;
  bool bVar2;
  uint32_t uVar3;
  LatticeImpl *pLVar4;
  long lVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  _Head_base<0UL,_void_*,_false> _Var6;
  ulong uVar7;
  undefined8 *in_RSI;
  long lVar8;
  Element EVar9;
  RandomFullLattice local_b8;
  RandomFullLattice local_a8;
  _Head_base<1UL,_void_(*)(void_*),_false> local_90;
  _Variadic_union<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  local_88;
  undefined1 local_68;
  undefined1 auStack_58 [8];
  vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
  elem;
  
  lVar5 = in_RSI[1];
  if (lVar5 == 0) {
LAB_00197ddf:
    lVar8 = 0;
  }
  else {
    if (*(char *)(lVar5 + 0x20) == '\0') {
      bVar2 = Random::pick<bool,bool>((Random *)*in_RSI,true,false);
      local_88._M_first._M_storage = (_Uninitialized<bool,_true>)bVar2;
      local_68 = 0;
      pLVar4 = (LatticeImpl *)operator_new(0x28);
LAB_00197d61:
      std::__detail::__variant::
      _Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
      ::_Move_ctor_base((_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)pLVar4,
                        (_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&local_88._M_first);
      this->rand = (Random *)
                   RandomElement<wasm::RandomFullLattice>::RandomElement::anon_class_1_0_00000001::
                   __invoke;
      (this->lattice)._M_t.
      super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
      .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl = pLVar4;
      std::__detail::__variant::
      _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
      ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                           *)&local_88._M_first);
      _Var6._M_head_impl = extraout_RDX;
      goto LAB_00198055;
    }
    if (lVar5 == 0) goto LAB_00197ddf;
    if (*(char *)(lVar5 + 0x20) == '\x01') {
      this_00 = (Random *)*in_RSI;
      uVar3 = Random::upTo(this_00,0x21);
      local_88._M_rest._0_4_ = (undefined4)Random::upTo(this_00,uVar3);
      local_68 = 1;
      pLVar4 = (LatticeImpl *)operator_new(0x28);
      goto LAB_00197d61;
    }
    if (lVar5 == 0) goto LAB_00197ddf;
    if (*(char *)(lVar5 + 0x20) == '\x02') {
      uVar3 = Random::upTo((Random *)*in_RSI,8);
      local_88._0_8_ = 0;
      switch(uVar3) {
      case 0:
        local_88._0_8_ = 1;
        break;
      case 2:
        local_88._0_8_ = 2;
        break;
      case 3:
        local_88._0_8_ = 4;
        break;
      case 4:
        uVar3 = Random::upTo((Random *)*in_RSI,2);
        local_88._0_8_ = (ulong)(uVar3 == 0) * 2 + 0x20;
        break;
      case 5:
        uVar3 = Random::upTo((Random *)*in_RSI,2);
        local_88._0_8_ = (ulong)(uVar3 == 0) * 2 + 0x58;
        break;
      case 6:
        uVar3 = Random::upTo((Random *)*in_RSI,2);
        local_88._0_8_ = (ulong)(uVar3 == 0) * 2 + 0x38;
        break;
      case 7:
        uVar3 = Random::upTo((Random *)*in_RSI,2);
        local_88._0_8_ = (ulong)(uVar3 == 0) * 2 + 0x40;
      }
      local_68 = 2;
      pLVar4 = (LatticeImpl *)operator_new(0x28);
      goto LAB_00197d61;
    }
    if (lVar5 == 0) goto LAB_00197ddf;
    lVar8 = 0;
    if (*(char *)(lVar5 + 0x20) == '\x03') {
      lVar8 = lVar5;
    }
  }
  if (lVar8 != 0) {
    makeElement((RandomFullLattice *)auStack_58);
    local_88._0_8_ = auStack_58;
    local_88._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68 = 3;
    pLVar4 = (LatticeImpl *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       *)pLVar4,
                      (_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       *)&local_88._M_first);
    this->rand = (Random *)
                 RandomElement<wasm::RandomFullLattice>::RandomElement::anon_class_1_0_00000001::
                 __invoke;
    (this->lattice)._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl = pLVar4;
    std::__detail::__variant::
    _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&local_88._M_first);
    _Var6._M_head_impl = extraout_RDX_00;
    if (elem.
        super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)auStack_58)();
      _Var6._M_head_impl = extraout_RDX_01;
    }
    if (lVar8 != 0) goto LAB_00198055;
  }
  lVar5 = in_RSI[1];
  lVar8 = 0;
  if ((lVar5 != 0) && (*(char *)(lVar5 + 0x20) == '\x04')) {
    lVar8 = lVar5;
  }
  if (lVar8 != 0) {
    makeElement((RandomFullLattice *)auStack_58);
    makeElement((RandomFullLattice *)
                &elem.
                 super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    lVar5 = 0;
    do {
      uVar1 = *(undefined8 *)
               ((long)&elem.
                       super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5);
      *(undefined8 *)((long)&local_88 + lVar5) = *(undefined8 *)(auStack_58 + lVar5);
      *(undefined8 *)((long)&local_88 + lVar5 + 8) = uVar1;
      *(undefined8 *)
       ((long)&elem.
               super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar5) = 0;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x20);
    local_68 = 4;
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&local_88._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&local_88._M_first);
    std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>::~array
              ((array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL> *)auStack_58);
    _Var6._M_head_impl = extraout_RDX_02;
    if (lVar8 != 0) goto LAB_00198055;
  }
  lVar5 = in_RSI[1];
  lVar8 = 0;
  if ((lVar5 != 0) && (*(char *)(lVar5 + 0x20) == '\x05')) {
    lVar8 = lVar5;
  }
  if (lVar8 != 0) {
    auStack_58 = (undefined1  [8])0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::reserve((vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
               *)auStack_58,*(size_type *)(lVar8 + 0x10));
    local_90._M_head_impl = (_func_void_void_ptr *)this;
    if (*(long *)(lVar8 + 0x10) != 0) {
      uVar7 = 0;
      do {
        makeElement((RandomFullLattice *)&local_88._M_first);
        std::
        vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>
        ::emplace_back<wasm::RandomElement<wasm::RandomFullLattice>>
                  ((vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>
                    *)auStack_58,(RandomElement<wasm::RandomFullLattice> *)&local_88._M_first);
        if ((pointer)local_88._8_8_ != (pointer)0x0) {
          (*(code *)local_88._0_8_)();
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < *(ulong *)(lVar8 + 0x10));
    }
    this = (RandomFullLattice *)local_90._M_head_impl;
    local_88._0_8_ = auStack_58;
    local_88._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_88._16_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_58 = (undefined1  [8])0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68 = 5;
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)local_90._M_head_impl,
               (ElementImpl *)&local_88._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&local_88._M_first);
    std::
    vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~vector((vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
               *)auStack_58);
    _Var6._M_head_impl = extraout_RDX_03;
    if (lVar8 != 0) goto LAB_00198055;
  }
  lVar5 = in_RSI[1];
  lVar8 = 0;
  if ((lVar5 != 0) && (*(char *)(lVar5 + 0x20) == '\x06')) {
    lVar8 = lVar5;
  }
  if (lVar8 != 0) {
    makeElement(&local_b8);
    makeElement(&local_a8);
    local_88._8_8_ =
         local_a8.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl;
    local_88._24_8_ =
         local_b8.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl;
    local_a8.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
            )0x0;
    local_88._0_8_ = local_a8.rand;
    local_b8.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
            )0x0;
    auStack_58 = (undefined1  [8])local_a8.rand;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8.rand;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._16_8_ = local_b8.rand;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68 = 6;
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&local_88._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&local_88._M_first);
    std::
    _Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
                    *)auStack_58);
    _Var6._M_head_impl = extraout_RDX_04;
    if (local_a8.lattice._M_t.
        super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
        .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         )0x0) {
      (*(code *)local_a8.rand)();
      _Var6._M_head_impl = extraout_RDX_05;
    }
    if (local_b8.lattice._M_t.
        super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
        .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         )0x0) {
      (*(code *)local_b8.rand)();
      _Var6._M_head_impl = extraout_RDX_06;
    }
    if (lVar8 != 0) {
LAB_00198055:
      EVar9.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
      super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
      _M_head_impl = _Var6._M_head_impl;
      EVar9.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
      super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
      super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
           (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
      return (Element)EVar9.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                      super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
    }
  }
  wasm::handle_unreachable
            ("unexpected lattice",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
             ,0x153);
}

Assistant:

RandomFullLattice::Element RandomFullLattice::makeElement() const noexcept {
  if (std::get_if<Bool>(lattice.get())) {
    return ElementImpl{rand.pick(true, false)};
  }
  if (std::get_if<UInt32>(lattice.get())) {
    return ElementImpl{rand.upToSquared(33)};
  }
  if (std::get_if<ValType>(lattice.get())) {
    Type type;
    // Choose a random type. No need to make all possible types available as
    // long as we cover all the kinds of relationships between types.
    switch (rand.upTo(8)) {
      case 0:
        type = Type::unreachable;
        break;
      case 1:
        type = Type::none;
        break;
      case 2:
        type = Type::i32;
        break;
      case 3:
        type = Type::f32;
        break;
      case 4:
        type = Type(HeapType::any, rand.oneIn(2) ? Nullable : NonNullable);
        break;
      case 5:
        type = Type(HeapType::none, rand.oneIn(2) ? Nullable : NonNullable);
        break;
      case 6:
        type = Type(HeapType::struct_, rand.oneIn(2) ? Nullable : NonNullable);
        break;
      case 7:
        type = Type(HeapType::array, rand.oneIn(2) ? Nullable : NonNullable);
        break;
    }
    return ElementImpl{type};
  }
  if (const auto* l = std::get_if<Inverted<RandomFullLattice>>(lattice.get())) {
    return ElementImpl{l->lattice.makeElement()};
  }
  if (const auto* l = std::get_if<ArrayFullLattice>(lattice.get())) {
    return ElementImpl{typename ArrayFullLattice::Element{
      l->lattice.makeElement(), l->lattice.makeElement()}};
  }
  if (const auto* l = std::get_if<Vector<RandomFullLattice>>(lattice.get())) {
    std::vector<typename RandomFullLattice::Element> elem;
    elem.reserve(l->size);
    for (size_t i = 0; i < l->size; ++i) {
      elem.push_back(l->lattice.makeElement());
    }
    return ElementImpl{std::move(elem)};
  }
  if (const auto* l = std::get_if<TupleFullLattice>(lattice.get())) {
    return ElementImpl{typename TupleFullLattice::Element{
      std::get<0>(l->lattices).makeElement(),
      std::get<1>(l->lattices).makeElement()}};
  }
  WASM_UNREACHABLE("unexpected lattice");
}